

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::EventControl::EventControl(EventControl *this,EventEdgeType edge,Var *var)

{
  int iVar1;
  UserException *this_00;
  allocator<char> local_41;
  string local_40;
  Var *local_20;
  Var *var_local;
  EventControl *pEStack_10;
  EventEdgeType edge_local;
  EventControl *this_local;
  
  this->delay = 0;
  this->var = var;
  this->type = Edge;
  this->edge = edge;
  this->delay_side = left;
  local_20 = var;
  var_local._4_4_ = edge;
  pEStack_10 = this;
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[7])();
  if (iVar1 != 1) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Event control variable cannot be a scalar",&local_41);
    UserException::UserException(this_00,&local_40);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

EventControl::EventControl(kratos::EventEdgeType edge, kratos::Var &var)
    : var(&var), type(EventControlType::Edge), edge(edge) {
    if (var.width() != 1) {
        throw UserException("Event control variable cannot be a scalar");
    }
}